

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPListener.cpp
# Opt level: O3

int __thiscall
hwnet::TCPListener::accept(TCPListener *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  int iVar1;
  uint *puVar2;
  undefined4 in_register_00000034;
  
  iVar1 = ::accept(this->fd,__addr,__addr_len);
  *(int *)CONCAT44(in_register_00000034,__fd) = iVar1;
  if (iVar1 < 0) {
    puVar2 = (uint *)__errno_location();
    do {
      if ((*puVar2 | 0x20) != 0x67) {
        return *puVar2;
      }
      iVar1 = ::accept(this->fd,__addr,__addr_len);
      *(int *)CONCAT44(in_register_00000034,__fd) = iVar1;
    } while (iVar1 < 0);
  }
  return 0;
}

Assistant:

int TCPListener::accept(int *fd_,struct sockaddr *addr_,socklen_t *len) {
	while((*fd_ = ::accept(this->fd,addr_,len)) < 0){
#ifdef EPROTO
		if(errno == EPROTO || errno == ECONNABORTED)
#else
		if(errno == ECONNABORTED)
#endif
			continue;
		else{
			return errno;
		}
	}
	return 0;	

}